

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::StartEnum(Parser *this,string *name,bool is_union,EnumDef **dest)

{
  Namespace *this_00;
  bool bVar1;
  EnumDef *this_01;
  BaseType BVar2;
  undefined7 in_register_00000011;
  undefined8 *in_R8;
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_01 = (EnumDef *)operator_new(0x138);
  EnumDef::EnumDef(this_01);
  std::__cxx11::string::_M_assign((string *)this_01);
  std::__cxx11::string::_M_assign((string *)&(this_01->super_Definition).file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this_01->super_Definition).doc_comment,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name[2]._M_string_length);
  this_01->is_union = SUB81(dest,0);
  this_00 = *(Namespace **)((long)&name[0xc].field_2 + 8);
  (this_01->super_Definition).defined_namespace = this_00;
  Namespace::GetFullyQualifiedName
            (&local_50,this_00,(string *)CONCAT71(in_register_00000011,is_union),1000);
  bVar1 = SymbolTable<flatbuffers::EnumDef>::Add
                    ((SymbolTable<flatbuffers::EnumDef> *)&name[7].field_2,&local_50,this_01);
  if (bVar1) {
    std::operator+(&local_70,"enum already exists: ",&local_50);
    Error(this,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    BVar2 = BASE_TYPE_INT;
    if (SUB81(dest,0) != false) {
      BVar2 = BASE_TYPE_UTYPE;
    }
    (this_01->underlying_type).base_type = BVar2;
    (this_01->underlying_type).enum_def = this_01;
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = this_01;
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartEnum(const std::string &name, bool is_union,
                               EnumDef **dest) {
  auto &enum_def = *new EnumDef();
  enum_def.name = name;
  enum_def.file = file_being_parsed_;
  enum_def.doc_comment = doc_comment_;
  enum_def.is_union = is_union;
  enum_def.defined_namespace = current_namespace_;
  const auto qualified_name = current_namespace_->GetFullyQualifiedName(name);
  if (enums_.Add(qualified_name, &enum_def))
    return Error("enum already exists: " + qualified_name);
  enum_def.underlying_type.base_type =
      is_union ? BASE_TYPE_UTYPE : BASE_TYPE_INT;
  enum_def.underlying_type.enum_def = &enum_def;
  if (dest) *dest = &enum_def;
  return NoError();
}